

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

monst * makemon(permonst *ptr,level *lev,int x,int y,int mmflags)

{
  byte bVar1;
  boolean bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  permonst *mdat;
  int iVar9;
  bool bVar10;
  bool bVar11;
  uint local_1b0;
  uint local_19c;
  bool local_17b;
  monst *local_178;
  int local_15c;
  undefined1 local_158 [4];
  int mhitdie;
  monst fakemon_1;
  int tryct_1;
  coord bypos_1;
  coord bypos;
  monst fakemon;
  int tryct;
  uint gpflags;
  int iStack_4c;
  boolean randpos_success;
  boolean countbirth;
  boolean allow_minvent;
  boolean byyou;
  boolean anymon;
  int xtyp;
  int mitem;
  int ct;
  int mcham;
  int mndx;
  monst *mtmp;
  int local_28;
  int mmflags_local;
  int y_local;
  int x_local;
  level *lev_local;
  permonst *ptr_local;
  
  iVar9 = (int)u.ux;
  iVar7 = (int)u.uy;
  bVar10 = (mmflags & 1U) == 0;
  bVar11 = true;
  uVar6 = 0;
  if ((mmflags & 0x80U) != 0) {
    uVar6 = 0x80;
  }
  if ((x == 0) && (y == 0)) {
    fakemon._116_4_ = 0;
    do {
      iVar4 = rn2(0x4d);
      mmflags_local = iVar4 + 2;
      local_28 = rn2(0x15);
      fakemon._116_4_ = fakemon._116_4_ + 1;
      if (ptr == (permonst *)0x0) {
        local_178 = (monst *)0x0;
      }
      else {
        local_178 = (monst *)&tryct_1;
      }
      bVar2 = goodpos(lev,mmflags_local,local_28,local_178,uVar6);
      if ((((bVar2 != '\0') || (bVar11 = true, 100 < (int)fakemon._116_4_)) &&
          (bVar11 = false, in_mklev == '\0')) && (bVar11 = false, (int)fakemon._116_4_ < 0x33)) {
        bVar11 = (viz_array[local_28][mmflags_local] & 2U) != 0;
      }
    } while (bVar11);
    bVar11 = (int)fakemon._116_4_ < 100;
  }
  else {
    local_28 = y;
    mmflags_local = x;
    if ((x == iVar9 && y == iVar7) && (in_mklev == '\0')) {
      bVar2 = enexto_core((coord *)&fakemon_1.field_0x76,lev,u.ux,u.uy,ptr,uVar6);
      if (bVar2 == '\0') {
        return (monst *)0x0;
      }
      mmflags_local = (int)(char)fakemon_1._118_1_;
      local_28 = (int)(char)fakemon_1._119_1_;
    }
  }
  if (((lev->monsters[mmflags_local][local_28] != (monst *)0x0) &&
      ((*(uint *)&lev->monsters[mmflags_local][local_28]->field_0x60 >> 9 & 1) == 0)) || (!bVar11))
  {
    if ((mmflags & 0x100U) == 0) {
      return (monst *)0x0;
    }
    bVar2 = enexto_core((coord *)&fakemon_1.field_0x74,lev,(xchar)mmflags_local,(xchar)local_28,ptr,
                        uVar6);
    if (bVar2 == '\0') {
      return (monst *)0x0;
    }
    mmflags_local = (int)(char)fakemon_1._116_1_;
    local_28 = (int)(char)fakemon_1._117_1_;
  }
  if (ptr == (permonst *)0x0) {
    fakemon_1.meating = 0;
    do {
      lev_local = (level *)rndmonst(lev);
      if (lev_local == (level *)0x0) {
        return (monst *)0x0;
      }
      fakemon_1.nmon = (monst *)lev_local;
      bVar2 = goodpos(lev,mmflags_local,local_28,(monst *)local_158,uVar6);
      iVar4 = fakemon_1.meating;
      if (bVar2 == '\0') {
        fakemon_1.meating = fakemon_1.meating + 1;
      }
      local_17b = bVar2 == '\0' && iVar4 < 0x32;
    } while (local_17b);
    ct = monsndx((permonst *)lev_local);
  }
  else {
    ct = monsndx(ptr);
    lev_local = (level *)ptr;
    if ((mvitals[ct].mvflags & 2) != 0) {
      return (monst *)0x0;
    }
  }
  sVar3 = quest_info(0x1f);
  if (ct == sVar3) {
    lev_local = (level *)&pm_leader;
  }
  else {
    sVar3 = quest_info(0x21);
    if (ct == sVar3) {
      lev_local = (level *)&pm_guardian;
    }
    else {
      sVar3 = quest_info(0x20);
      if (ct == sVar3) {
        lev_local = (level *)&pm_nemesis;
      }
    }
  }
  propagate(ct,(mmflags & 0x40U) == 0,'\0');
  iStack_4c = (int)*(short *)(lev_local->levname + 0x2c);
  if ((mmflags & 4U) == 0) {
    if ((mmflags & 8U) != 0) {
      iStack_4c = 2;
    }
  }
  else {
    iStack_4c = 3;
  }
  _mcham = newmonst(iStack_4c,0);
  _mcham->nmon = lev->monlist;
  lev->monlist = _mcham;
  uVar6 = flags.ident + 1;
  _mcham->m_id = flags.ident;
  flags.ident = uVar6;
  if (_mcham->m_id == 0) {
    uVar6 = flags.ident + 1;
    _mcham->m_id = flags.ident;
    flags.ident = uVar6;
  }
  set_mon_data(_mcham,(permonst *)lev_local,0);
  if (_mcham->data->msound == '\x1f') {
    quest_status.leader_m_id = _mcham->m_id;
  }
  _mcham->mnum = (short)ct;
  iVar4 = adj_lev(&lev->z,(permonst *)lev_local);
  _mcham->m_lev = (uchar)iVar4;
  if (lev_local->levname[8] == '7') {
    iVar4 = golemhp(ct);
    _mcham->mhp = iVar4;
    _mcham->mhpmax = iVar4;
  }
  else if (((lev_local == (level *)(mons + 0x144)) || (lev_local == (level *)(mons + 0x146))) ||
          (lev_local == (level *)(mons + 0x145))) {
    iVar4 = dice(8,8);
    _mcham->mhp = iVar4 + 100;
    _mcham->mhpmax = iVar4 + 100;
  }
  else if (lev_local->levname[9] < '2') {
    if (((lev_local->levname[8] == '\x1e') && (0x92 < ct)) &&
       ((lev->z).dnum == dungeon_topology.d_astral_level.dnum)) {
      bVar1 = _mcham->m_lev;
      iVar4 = dice((uint)_mcham->m_lev,8);
      iVar4 = (uint)bVar1 * 7 + iVar4;
      _mcham->mhp = iVar4;
      _mcham->mhpmax = iVar4;
    }
    else if (_mcham->m_lev == '\0') {
      iVar4 = rnd(4);
      _mcham->mhp = iVar4;
      _mcham->mhpmax = iVar4;
    }
    else if (lev_local->levname[0x2e] == '\x1f') {
      iVar4 = rnd(0x1e);
      _mcham->mhp = iVar4 + 0x87;
      _mcham->mhpmax = iVar4 + 0x87;
    }
    else {
      switch(_mcham->data->msize) {
      case '\0':
        local_15c = 4;
        break;
      case '\x01':
        local_15c = 6;
        break;
      case '\x02':
      default:
        local_15c = 8;
        break;
      case '\x03':
        local_15c = 10;
        break;
      case '\x04':
        local_15c = 0xc;
        break;
      case '\a':
        local_15c = 0xf;
      }
      iVar4 = dice((uint)_mcham->m_lev,local_15c);
      _mcham->mhp = iVar4;
      _mcham->mhpmax = iVar4;
      bVar2 = is_home_elemental(&lev->z,(permonst *)lev_local);
      if (bVar2 != '\0') {
        iVar4 = _mcham->mhp * 3;
        _mcham->mhp = iVar4;
        _mcham->mhpmax = iVar4;
      }
    }
  }
  else {
    iVar4 = (lev_local->levname[9] + -6) * 2;
    _mcham->mhp = iVar4;
    _mcham->mhpmax = iVar4;
    _mcham->m_lev = (uchar)((long)_mcham->mhp / 4);
  }
  if ((*(uint *)(lev_local->levname + 0x34) & 0x20000) == 0) {
    if ((*(uint *)(lev_local->levname + 0x34) & 0x10000) == 0) {
      uVar6 = rn2(2);
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffffe | uVar6 & 1;
    }
    else {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffffe;
    }
  }
  else {
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffffe | 1;
  }
  if (((lev->z).dnum == dungeon_topology.d_sokoban_dnum) &&
     ((*(uint *)(lev_local->levname + 0x30) & 0x10000) == 0)) {
    _mcham->mtrapseen = 0x1400;
  }
  if (lev_local->levname[0x2e] == '\x1f') {
    _mcham->mtrapseen = _mcham->mtrapseen | 0x20000;
  }
  _mcham->dlevel = lev;
  place_monster(_mcham,mmflags_local,local_28);
  *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffbffff | 0x40000;
  *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffdffff | 0x20000;
  if ((mmflags & 0x10U) == 0) {
    bVar2 = peace_minded((permonst *)lev_local);
    local_19c = (uint)bVar2;
  }
  else {
    local_19c = 0;
  }
  *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffbfffff | (local_19c & 1) << 0x16
  ;
  switch(lev_local->levname[8]) {
  case '\f':
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfff7ffff | 0x80000;
    break;
  case '\r':
    set_mimic_sym(_mcham,lev);
    break;
  case '\x0e':
    if ((u.uhave._0_1_ & 1) == 0) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfff7ffff | 0x80000;
    }
    break;
  case '\x0f':
    if (urace.malenum == 0x111) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffbfffff;
    }
    break;
  case '\x13':
  case '-':
    if (((in_mklev != '\0') && (mmflags_local != 0)) && (local_28 != 0)) {
      mkobj_at('\0',lev,mmflags_local,local_28,'\x01');
    }
    if (((*(uint *)(lev_local->levname + 0x30) & 0x80) != 0) &&
       (lev->objects[mmflags_local][local_28] != (obj *)0x0)) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffffff7f | 0x80;
    }
    break;
  case '\x15':
    if ((lev_local->levname[8] == '\x15') &&
       ((*(uint *)(lev_local->levname + 0x34) & 0x20000000) != 0)) {
      iVar4 = sgn((int)u.ualign.type);
      iVar5 = sgn((int)lev_local->levname[0xd]);
      if (iVar4 == iVar5) {
        *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffbfffff | 0x400000;
      }
    }
    break;
  case '\x19':
  case '\x1f':
    if ((ct == 0x9e) || (ct == 0x7b)) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffff7 | 8;
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffffd | 2;
    }
    break;
  case '\x1c':
    bVar2 = In_hell(&lev->z);
    if ((bVar2 != '\0') &&
       (((lev_local == (level *)(mons + 0x82) || (lev_local == (level *)(mons + 0x83))) ||
        (lev_local == (level *)(mons + 0x85))))) {
      mon_adjust_speed(_mcham,2,(obj *)0x0);
    }
    break;
  case '$':
    iVar4 = rn2(5);
    if ((iVar4 != 0) && ((u.uhave._0_1_ & 1) == 0)) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfff7ffff | 0x80000;
    }
  }
  if (((_mcham->data->mlet != '\x19') && (_mcham->data != mons + 0x20)) &&
     ((_mcham->data != mons + 0x21 && (_mcham->data != mons + 0x101)))) {
    pcVar8 = mons_mname(_mcham->data);
    iVar4 = strcmp(pcVar8,"gold dragon");
    if (iVar4 != 0) {
      pcVar8 = mons_mname(_mcham->data);
      iVar4 = strcmp(pcVar8,"baby gold dragon");
      if ((iVar4 != 0) && (_mcham->data != mons + 0x73)) {
        local_1b0 = (uint)(_mcham->data == mons + 0xa0);
        goto LAB_0020848f;
      }
    }
  }
  local_1b0 = 1;
LAB_0020848f:
  if (local_1b0 != 0) {
    new_light_source(lev,_mcham->mx,_mcham->my,local_1b0,1,_mcham);
  }
  _countbirth = 0;
  uVar6 = pm_to_cham(ct);
  if (uVar6 == 0) {
    if (ct == 0x128) {
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xdfffffff | 0x20000000;
      flags.no_of_wizards = flags.no_of_wizards + 1;
      if ((flags.no_of_wizards == 1) &&
         (bVar2 = on_level(&lev->z,&dungeon_topology.d_earth_level), bVar2 != '\0')) {
        _countbirth = 0x17d;
      }
    }
    else if (ct == 0x147) {
      flags.djinni_count = flags.djinni_count + 1;
    }
    else if ((ct == 0x12a) && (flags.ghost_count = flags.ghost_count + 1, (mmflags & 0x20U) == 0)) {
      pcVar8 = rndghostname();
      _mcham = christen_monst(_mcham,pcVar8);
    }
  }
  else if ((u.uprops[0x17].intrinsic == 0) && (u.uprops[0x17].extrinsic == 0)) {
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffffff8f | (uVar6 & 7) << 4;
    mdat = rndmonst(lev);
    newcham(lev,_mcham,mdat,'\0','\0');
  }
  else {
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffffff8f;
  }
  if ((_countbirth != 0) && (bVar10)) {
    mongets(_mcham,_countbirth);
  }
  if (in_mklev == '\0') {
    if (x == iVar9 && y == iVar7) {
      newsym((int)_mcham->mx,(int)_mcham->my);
      set_apparxy(lev,_mcham);
    }
  }
  else if ((((((*(uint *)(lev_local->levname + 0x34) & 0x200) != 0) &&
             ((*(uint *)(lev_local->levname + 0x34) & 0x1800) == 0)) || (ct == 0x56)) ||
           ((ct == 0x76 || (ct == 0x14c)))) &&
          (((u.uhave._0_1_ & 1) == 0 && (iVar7 = rn2(5), iVar7 != 0)))) {
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfff7ffff | 0x80000;
  }
  if ((((*(uint *)(lev_local->levname + 0x34) & 0x200) != 0) &&
      ((*(uint *)(lev_local->levname + 0x34) & 0x1000) != 0)) &&
     (lev_local->levname[0x2e] == '\x1c')) {
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffff7 | 8;
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xfffffffd | 2;
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffbfffff | 0x400000;
    *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffff7fff;
    if ((uwep != (obj *)0x0) && (uwep->oartifact == '\x01')) {
      _mcham->mtame = '\0';
      *(uint *)&_mcham->field_0x60 = *(uint *)&_mcham->field_0x60 & 0xffbfffff;
    }
  }
  if (ct == 0x76) {
    uVar6 = get_wormno(lev);
    _mcham->wormno = (uchar)uVar6;
    if ((uVar6 & 0xff) != 0) {
      iVar7 = rn2(5);
      initworm(_mcham,iVar7);
      iVar7 = count_wsegs(_mcham);
      if (iVar7 != 0) {
        place_worm_tail_randomly(_mcham,(xchar)mmflags_local,(xchar)local_28);
      }
    }
  }
  set_malign(_mcham);
  if (ptr == (permonst *)0x0) {
    if (((*(ushort *)(lev_local->levname + 0xe) & 0x80) == 0) || (iVar7 = rn2(2), iVar7 == 0)) {
      if ((*(ushort *)(lev_local->levname + 0xe) & 0x40) != 0) {
        iVar7 = rn2(3);
        if (iVar7 == 0) {
          m_initgrp(_mcham,lev,(int)_mcham->mx,(int)_mcham->my,3);
        }
        else {
          m_initgrp(_mcham,lev,(int)_mcham->mx,(int)_mcham->my,10);
        }
      }
    }
    else {
      m_initgrp(_mcham,lev,(int)_mcham->mx,(int)_mcham->my,3);
    }
  }
  if (bVar10) {
    bVar2 = attacktype((permonst *)lev_local,0xfe);
    if (bVar2 != '\0') {
      m_initweap(lev,_mcham);
    }
    m_initinv(_mcham);
    m_dowear(lev,_mcham,'\x01');
  }
  else {
    if (_mcham->minvent != (obj *)0x0) {
      discard_minvent(_mcham);
    }
    _mcham->minvent = (obj *)0x0;
  }
  if (((*(ushort *)(lev_local->levname + 0x38) & 0xc0) != 0) && ((mmflags & 2U) == 0)) {
    if ((*(ushort *)(lev_local->levname + 0x38) & 0x40) != 0) {
      _mcham->mstrategy = _mcham->mstrategy | 0x20000000;
    }
    if ((*(ushort *)(lev_local->levname + 0x38) & 0x80) != 0) {
      _mcham->mstrategy = _mcham->mstrategy | 0x10000000;
    }
  }
  if (in_mklev == '\0') {
    newsym((int)_mcham->mx,(int)_mcham->my);
  }
  return _mcham;
}

Assistant:

struct monst *makemon(const struct permonst *ptr,
		      struct level *lev, int x, int y, int mmflags)
{
	struct monst *mtmp;
	int mndx, mcham, ct, mitem, xtyp;
	boolean anymon = (!ptr);
	boolean byyou = (x == u.ux && y == u.uy);
	boolean allow_minvent = ((mmflags & NO_MINVENT) == 0);
	boolean countbirth = ((mmflags & MM_NOCOUNTBIRTH) == 0);
	boolean randpos_success = TRUE;	/* in case we aren't randomly positioning */
	unsigned gpflags = (mmflags & MM_IGNOREWATER) ? MM_IGNOREWATER : 0;

	/* if caller wants random location, do it here */
	if (x == 0 && y == 0) {
		int tryct = 0;	/* careful with bigrooms */
		struct monst fakemon;

		fakemon.data = ptr;	/* set up for goodpos */
		do {
			x = rn1(COLNO - 3, 2);
			y = rn2(ROWNO);
			tryct++;
		} while ((!goodpos(lev, x, y, ptr ? &fakemon : NULL, gpflags) &&
			  tryct <= 100) ||
			 (!in_mklev && tryct <= 50 && cansee(x, y)));
		randpos_success = tryct < 100;
	} else if (byyou && !in_mklev) {
		coord bypos;

		if (enexto_core(&bypos, lev, u.ux, u.uy, ptr, gpflags)) {
			x = bypos.x;
			y = bypos.y;
		} else
			return NULL;
	}

	/* Use adjacent position if chosen place is occupied, or
	 * random positioning was asked for but failed. */
	if (MON_AT(lev, x, y) || !randpos_success) {
		if ((mmflags & MM_ADJACENTOK) != 0) {
			coord bypos;
			if (enexto_core(&bypos, lev, x, y, ptr, gpflags)) {
				x = bypos.x;
				y = bypos.y;
			} else
				return NULL;
		} else 
			return NULL;
	}

	if (ptr){
		mndx = monsndx(ptr);
		/* if you are to make a specific monster and it has
		   already been genocided, return */
		if (mvitals[mndx].mvflags & G_GENOD)
		    return NULL;
	} else {
		/* make a random (common) monster that can survive here.
		 * (the special levels ask for random monsters at specific
		 * positions, causing mass drowning on the medusa level,
		 * for instance.)
		 */
		int tryct = 0;	/* maybe there are no good choices */
		struct monst fakemon;
		do {
			if (!(ptr = rndmonst(lev))) {
			    return NULL;	/* no more monsters! */
			}
			fakemon.data = ptr;	/* set up for goodpos */
		} while (!goodpos(lev, x, y, &fakemon, gpflags) && tryct++ < 50);
		mndx = monsndx(ptr);
	}
	
	if (mndx == quest_info(MS_LEADER))
	    ptr = &pm_leader;
	else if (mndx == quest_info(MS_GUARDIAN))
	    ptr = &pm_guardian;
	else if (mndx == quest_info(MS_NEMESIS))
	    ptr = &pm_nemesis;
	
	propagate(mndx, countbirth, FALSE);

	xtyp = ptr->pxtyp;
	if (mmflags & MM_EDOG)
	    xtyp = MX_EDOG;
	else if (mmflags & MM_EMIN)
	    xtyp = MX_EMIN;
	
	mtmp = newmonst(xtyp, 0);
	mtmp->nmon = lev->monlist;
	lev->monlist = mtmp;
	mtmp->m_id = flags.ident++;
	if (!mtmp->m_id)
	    mtmp->m_id = flags.ident++;	/* ident overflowed */
	set_mon_data(mtmp, ptr, 0);
	
	if (mtmp->data->msound == MS_LEADER)
	    quest_status.leader_m_id = mtmp->m_id;
	mtmp->mnum = mndx;

	mtmp->m_lev = adj_lev(&lev->z, ptr);
	if (is_golem(ptr)) {
	    mtmp->mhpmax = mtmp->mhp = golemhp(mndx);
	} else if (is_rider(ptr)) {
	    /* We want low HP, but a high mlevel so they can attack well
	     *
	     * DSR 10/31/09: What, are you nuts?  They're way too crunchy. */
	    mtmp->mhpmax = mtmp->mhp = 100 + dice(8,8);
	} else if (ptr->mlevel > 49) {
	    /* "special" fixed hp monster
	     * the hit points are encoded in the mlevel in a somewhat strange
	     * way to fit in the 50..127 positive range of a signed character
	     * above the 1..49 that indicate "normal" monster levels */
	    mtmp->mhpmax = mtmp->mhp = 2*(ptr->mlevel - 6);
	    mtmp->m_lev = mtmp->mhp / 4;	/* approximation */
	} else if (ptr->mlet == S_DRAGON && mndx >= PM_GRAY_DRAGON &&
		   In_endgame(&lev->z)) {
	    /* dragons in the endgame are always at least average HP
	     * note modified hit die here as well; they're MZ_GIGANTIC */
	    mtmp->mhpmax = mtmp->mhp = 7 * mtmp->m_lev + dice((int)mtmp->m_lev, 8);
	} else if (!mtmp->m_lev) {
	    mtmp->mhpmax = mtmp->mhp = rnd(4);	/* level 0 monsters are pathetic */
	} else if (ptr->msound == MS_LEADER) {
	    /* Quest Leaders need to be fairly burly */
	    mtmp->mhpmax = mtmp->mhp = 135 + rnd(30);
	} else {
	    /* plain old ordinary monsters; modify hit die based on size;
	     * big-ass critters like mastodons should have big-ass HP, and
	     * small things like bees and locusts should get less */
	    int mhitdie;
	    switch (mtmp->data->msize) {
		case MZ_TINY: mhitdie = 4; break;
		case MZ_SMALL: mhitdie = 6; break;
		case MZ_LARGE: mhitdie = 10; break;
		case MZ_HUGE: mhitdie = 12; break;
		case MZ_GIGANTIC: mhitdie = 15; break;
		case MZ_MEDIUM:
		default:
		    mhitdie = 8;
		    break;
	    }
	    mtmp->mhpmax = mtmp->mhp = dice((int)mtmp->m_lev, mhitdie);
	    if (is_home_elemental(&lev->z, ptr))
		mtmp->mhpmax = (mtmp->mhp *= 3);
	}

	if (is_female(ptr)) mtmp->female = TRUE;
	else if (is_male(ptr)) mtmp->female = FALSE;
	else mtmp->female = rn2(2);	/* ignored for neuters */

	if (In_sokoban(&lev->z) && !mindless(ptr))  /* know about traps here */
	    mtmp->mtrapseen = (1L << (PIT - 1)) | (1L << (HOLE - 1));
	if (ptr->msound == MS_LEADER)		/* leader knows about portal */
	    mtmp->mtrapseen |= (1L << (MAGIC_PORTAL-1));

	mtmp->dlevel = lev;
	place_monster(mtmp, x, y);
	mtmp->mcansee = mtmp->mcanmove = TRUE;
	mtmp->mpeaceful = (mmflags & MM_ANGRY) ? FALSE : peace_minded(ptr);

	switch(ptr->mlet) {
		case S_MIMIC:
			set_mimic_sym(mtmp, lev);
			break;
		case S_SPIDER:
		case S_SNAKE:
			if (in_mklev)
			    if (x && y)
				mkobj_at(0, lev, x, y, TRUE);
			if (hides_under(ptr) && OBJ_AT_LEV(lev, x, y))
			    mtmp->mundetected = TRUE;
			break;
		case S_LIGHT:
		case S_ELEMENTAL:
			if (mndx == PM_STALKER || mndx == PM_BLACK_LIGHT) {
			    mtmp->perminvis = TRUE;
			    mtmp->minvis = TRUE;
			}
			break;
		case S_LEPRECHAUN:
			mtmp->msleeping = 1;
			break;
		case S_JABBERWOCK:
			if (rn2(5) && !u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_NYMPH:
			if (!u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_ORC:
			if (Race_if (PM_ELF)) mtmp->mpeaceful = FALSE;
			break;
		case S_UNICORN:
			if (is_unicorn(ptr) &&
					sgn(u.ualign.type) == sgn(ptr->maligntyp))
				mtmp->mpeaceful = TRUE;
			break;
		case S_BAT:
			if (In_hell(&lev->z) && is_bat(ptr))
			    mon_adjust_speed(mtmp, 2, NULL);
			break;
	}
	if ((ct = emits_light(mtmp->data)) > 0)
		new_light_source(lev, mtmp->mx, mtmp->my, ct,
				 LS_MONSTER, mtmp);
	mitem = 0;	/* extra inventory item for this monster */

	if ((mcham = pm_to_cham(mndx)) != CHAM_ORDINARY) {
		/* If you're protected with a ring, don't create
		 * any shape-changing chameleons -dgk
		 */
		if (Protection_from_shape_changers)
			mtmp->cham = CHAM_ORDINARY;
		else {
			mtmp->cham = mcham;
			newcham(lev, mtmp, rndmonst(lev), FALSE, FALSE);
		}
	} else if (mndx == PM_WIZARD_OF_YENDOR) {
		mtmp->iswiz = TRUE;
		flags.no_of_wizards++;
		if (flags.no_of_wizards == 1 && Is_earthlevel(&lev->z))
			mitem = SPE_DIG;
	} else if (mndx == PM_DJINNI) {
		flags.djinni_count++;
	} else if (mndx == PM_GHOST) {
		flags.ghost_count++;
		if (!(mmflags & MM_NONAME))
			mtmp = christen_monst(mtmp, rndghostname());
	}
	if (mitem && allow_minvent) mongets(mtmp, mitem);

	if (in_mklev) {
		if (((is_ndemon(ptr)) ||
		    (mndx == PM_WUMPUS) ||
		    (mndx == PM_LONG_WORM) ||
		    (mndx == PM_GIANT_EEL)) && !u.uhave.amulet && rn2(5))
			mtmp->msleeping = TRUE;
	} else {
		if (byyou) {
			newsym(mtmp->mx,mtmp->my);
			set_apparxy(lev, mtmp);
		}
	}
	if (is_dprince(ptr) && ptr->msound == MS_BRIBE) {
	    mtmp->mpeaceful = mtmp->minvis = mtmp->perminvis = 1;
	    mtmp->mavenge = 0;
	    if (uwep && uwep->oartifact == ART_EXCALIBUR)
		mtmp->mpeaceful = mtmp->mtame = FALSE;
	}
	if (mndx == PM_LONG_WORM && (mtmp->wormno = get_wormno(lev)) != 0)
	{
	    /* we can now create worms with tails - 11/91 */
	    initworm(mtmp, rn2(5));
	    if (count_wsegs(mtmp)) place_worm_tail_randomly(mtmp, x, y);
	}
	set_malign(mtmp);		/* having finished peaceful changes */
	if (anymon) {
	    if ((ptr->geno & G_SGROUP) && rn2(2)) {
		m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    } else if (ptr->geno & G_LGROUP) {
		if (rn2(3))  m_initlgrp(mtmp, lev, mtmp->mx, mtmp->my);
		else	    m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    }
	}

	if (allow_minvent) {
	    if (is_armed(ptr))
		m_initweap(lev, mtmp);	/* equip with weapons / armor */
	    m_initinv(mtmp);  /* add on a few special items incl. more armor */
	    m_dowear(lev, mtmp, TRUE);
	} else {
	    /* no initial inventory is allowed */
	    if (mtmp->minvent) discard_minvent(mtmp);
	    mtmp->minvent = NULL;    /* caller expects this */
	}
	if ((ptr->mflags3 & M3_WAITMASK) && !(mmflags & MM_NOWAIT)) {
		if (ptr->mflags3 & M3_WAITFORU)
			mtmp->mstrategy |= STRAT_WAITFORU;
		if (ptr->mflags3 & M3_CLOSE)
			mtmp->mstrategy |= STRAT_CLOSE;
	}

	if (!in_mklev)
	    newsym(mtmp->mx,mtmp->my);	/* make sure the mon shows up */

	return mtmp;
}